

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O3

void __thiscall FModelVertexBuffer::BindVBO(FModelVertexBuffer *this)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  _func_void_GLenum **pp_Var4;
  _func_void_GLenum **pp_Var5;
  
  (*_ptrc_glBindBuffer)(0x8893,this->ibo_id);
  (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
  if (gl.legacyMode == false) {
    (*_ptrc_glEnableVertexAttribArray)(0);
    GVar1 = 2;
    GVar2 = 3;
    GVar3 = 1;
    pp_Var4 = (_func_void_GLenum **)&_ptrc_glEnableVertexAttribArray;
    pp_Var5 = (_func_void_GLenum **)&_ptrc_glDisableVertexAttribArray;
  }
  else {
    GVar1 = 0x8076;
    pp_Var5 = &_ptrc_glDisableClientState;
    GVar2 = 0x8078;
    GVar3 = 0x8074;
    pp_Var4 = &_ptrc_glEnableClientState;
  }
  (**pp_Var4)(GVar3);
  (**pp_Var4)(GVar2);
  (**pp_Var5)(GVar1);
  return;
}

Assistant:

void FModelVertexBuffer::BindVBO()
{
	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, ibo_id);
	glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
	if (!gl.legacyMode)
	{
		glEnableVertexAttribArray(VATTR_VERTEX);
		glEnableVertexAttribArray(VATTR_TEXCOORD);
		glEnableVertexAttribArray(VATTR_VERTEX2);
		glDisableVertexAttribArray(VATTR_COLOR);
	}
	else
	{
		glEnableClientState(GL_VERTEX_ARRAY);
		glEnableClientState(GL_TEXTURE_COORD_ARRAY);
		glDisableClientState(GL_COLOR_ARRAY);
	}
}